

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O1

S1ChordAngle operator+(S1ChordAngle a,S1ChordAngle b)

{
  S1ChordAngle SVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  S1ChordAngle local_28;
  double local_20;
  S2LogMessage local_18;
  
  dVar2 = ABS(a.length2_);
  if ((uint)((long)dVar2 + 0xfff0000000000000U >> 0x35) < 0x3ff && (long)a.length2_ < 0 ||
      (dVar2 == INFINITY || (long)dVar2 - 1U < 0xfffffffffffff && (long)a.length2_ < 0)) {
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
               ,99,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_18.stream_,"Check failed: !a.is_special() ",0x1e);
  }
  else {
    dVar2 = ABS(b.length2_);
    if ((0x3fe < (uint)((long)dVar2 + 0xfff0000000000000U >> 0x35) || -1 < (long)b.length2_) &&
        (dVar2 != INFINITY && (0xffffffffffffe < (long)dVar2 - 1U || -1 < (long)b.length2_))) {
      if ((b.length2_ != 0.0) || (SVar1.length2_ = a.length2_, NAN(b.length2_))) {
        if (4.0 <= a.length2_ + b.length2_) {
          local_28.length2_ = 4.0;
          SVar1.length2_ = local_28.length2_;
        }
        else {
          dVar4 = (1.0 - b.length2_ * 0.25) * a.length2_;
          dVar2 = (1.0 - a.length2_ * 0.25) * b.length2_;
          dVar3 = dVar2 + dVar4;
          dVar2 = dVar2 * dVar4;
          if (dVar2 < 0.0) {
            local_20 = dVar3;
            dVar2 = sqrt(dVar2);
            dVar3 = local_20;
          }
          else {
            dVar2 = SQRT(dVar2);
          }
          dVar3 = dVar3 + dVar2 + dVar2;
          if (4.0 <= dVar3) {
            dVar3 = 4.0;
          }
          S1ChordAngle::S1ChordAngle(&local_28,dVar3);
          SVar1.length2_ = local_28.length2_;
        }
      }
      local_28.length2_ = SVar1.length2_;
      return (S1ChordAngle)local_28.length2_;
    }
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
               ,100,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_18.stream_,"Check failed: !b.is_special() ",0x1e);
  }
  abort();
}

Assistant:

S1ChordAngle operator+(S1ChordAngle a, S1ChordAngle b) {
  // Note that this method is much more efficient than converting the chord
  // angles to S1Angles and adding those.  It requires only one square root
  // plus a few additions and multiplications.
  S2_DCHECK(!a.is_special());
  S2_DCHECK(!b.is_special());

  // Optimization for the common case where "b" is an error tolerance
  // parameter that happens to be set to zero.
  double a2 = a.length2(), b2 = b.length2();
  if (b2 == 0) return a;

  // Clamp the angle sum to at most 180 degrees.
  if (a2 + b2 >= kMaxLength2) return S1ChordAngle::Straight();

  // Let "a" and "b" be the (non-squared) chord lengths, and let c = a+b.
  // Let A, B, and C be the corresponding half-angles (a = 2*sin(A), etc).
  // Then the formula below can be derived from c = 2 * sin(A+B) and the
  // relationships   sin(A+B) = sin(A)*cos(B) + sin(B)*cos(A)
  //                 cos(X) = sqrt(1 - sin^2(X)) .

  double x = a2 * (1 - 0.25 * b2);  // is_valid() => non-negative
  double y = b2 * (1 - 0.25 * a2);  // is_valid() => non-negative
  return S1ChordAngle(min(kMaxLength2, x + y + 2 * sqrt(x * y)));
}